

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAddqAn<(moira::Instr)4,(moira::Mode)1,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  An local_4c [2];
  Ims<2> local_44;
  int local_40;
  An local_38 [2];
  Imd local_30;
  int local_2c;
  byte local_24;
  byte local_23;
  u16 local_22;
  u8 dst;
  u8 src;
  u32 *puStack_20;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_23 = (byte)((int)(uint)op >> 9) & 7;
  local_24 = (byte)op & 7;
  if (((int)(uint)op >> 9 & 7U) == 0) {
    local_23 = 8;
  }
  local_22 = op;
  puStack_20 = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  if (str->style->syntax == MUSASHI) {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_2c = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_2c);
    Imd::Imd(&local_30,(uint)local_23);
    pSVar1 = StrWriter::operator<<(pSVar1,local_30);
    pSVar1 = StrWriter::operator<<(pSVar1);
    An::An(local_38,(uint)local_24);
    StrWriter::operator<<(pSVar1,local_38[0]);
  }
  else {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_40 = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_40);
    Ims<2>::Ims(&local_44,(uint)local_23);
    pSVar1 = StrWriter::operator<<(pSVar1,local_44);
    pSVar1 = StrWriter::operator<<(pSVar1);
    An::An(local_4c,(uint)local_24);
    StrWriter::operator<<(pSVar1,local_4c[0]);
  }
  return;
}

Assistant:

void
Moira::dasmAddqAn(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = ____xxx_________(op);
    auto dst = _____________xxx(op);

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << An{dst};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << An{dst};
    }
}